

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O3

int __thiscall ScapeGoatTree::addWithDepth(ScapeGoatTree *this,Node *node)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Node *pNVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  
  pNVar5 = this->root;
  if (pNVar5 != (Node *)0x0) {
    iVar4 = 1;
    do {
      if (node->value < pNVar5->value) {
        pNVar3 = pNVar5->leftChild;
        if (pNVar5->leftChild == (Node *)0x0) goto LAB_0010685e;
      }
      else {
        if (node->value <= pNVar5->value) {
          return -1;
        }
        pNVar6 = pNVar5;
        pNVar3 = pNVar5->rightChild;
        if (pNVar5->rightChild == (Node *)0x0) goto LAB_0010686d;
      }
      pNVar5 = pNVar3;
      iVar4 = iVar4 + 1;
    } while( true );
  }
  this->root = node;
  iVar4 = 0;
LAB_00106874:
  uVar1 = this->n;
  uVar2 = this->q;
  this->n = uVar1 + 1;
  this->q = uVar2 + 1;
  return iVar4;
LAB_0010685e:
  pNVar6 = (Node *)&pNVar5->leftChild;
LAB_0010686d:
  pNVar6->rightChild = node;
  node->parent = pNVar5;
  goto LAB_00106874;
}

Assistant:

int ScapeGoatTree::addWithDepth(Node *node) {
    Node *w = root;
    if (w == nullptr) {
        root = node;
        n++;
        q++;
        return 0;
    }
    bool done = false;
    int d = 0;
    do {
        if (node->value < w->value) {
            if (w->leftChild == nullptr) {
                w->leftChild = node;
                node->parent = w;
                done = true;
            } else {
                w = w->leftChild;
            }
        } else if (node->value > w->value) {
            if (w->rightChild == nullptr) {
                w->rightChild = node;
                node->parent = w;
                done = true;
            } else {
                w = w->rightChild;
            }
        } else {
            return -1;
        }
        d++;
    } while (!done);

    n++;
    q++;
    return d;
}